

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void env_free(Environment *env)

{
  ObjectType OVar1;
  Record *pRVar2;
  Object *__ptr;
  Record *__ptr_00;
  Record *rec;
  
  __ptr_00 = env->front;
  do {
    if (__ptr_00 == (Record *)0x0) {
      free(env);
      return;
    }
    pRVar2 = __ptr_00->next;
    OVar1 = (__ptr_00->object).type;
    if (OVar1 == OBJECT_INSTANCE) {
      __ptr = (Object *)(__ptr_00->object).field_1.instance;
      OVar1 = __ptr->type;
      __ptr->type = OVar1 - OBJECT_LITERAL;
      if (((int)OVar1 < 2) && (*(int *)((long)&__ptr->field_1 + 8) == 0)) {
        env_free(*(Environment **)((long)&__ptr->field_1 + 0x10));
        goto LAB_001062ac;
      }
    }
    else if (OVar1 == OBJECT_ARRAY) {
      __ptr = (__ptr_00->object).field_1.arr.values;
LAB_001062ac:
      free(__ptr);
    }
    free(__ptr_00);
    env->front = pRVar2;
    __ptr_00 = pRVar2;
  } while( true );
}

Assistant:

void env_free(Environment *env){
    while(env->front != NULL){
        Record *rec = env->front;
        Record *bak = rec->next;
        if(rec->object.type == OBJECT_ARRAY)
            memfree(rec->object.arr.values);
        else if(rec->object.type == OBJECT_INSTANCE){
            gc_rec(rec);
        }
        //        memfree(rec->name);
        memfree(rec);
        env->front = bak;
    }
    memfree(env);
}